

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Test.cpp
# Opt level: O1

Token lexRawToken(string_view text)

{
  SourceBuffer buffer_00;
  SourceManager *this;
  long lVar1;
  Diagnostic *__location;
  StringRef macroName;
  StringRef capturedExpression;
  Token token;
  AssertionHandler catchAssertionHandler;
  table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
  arrays;
  SourceBuffer buffer;
  Lexer lexer;
  Token local_3e8;
  AssertionHandler local_3d8;
  ITransientExpression local_390;
  Token *local_380;
  LexerOptions local_378;
  SourceBuffer local_338;
  Lexer local_318;
  
  if (DAT_00646ff0 != 0) {
    lVar1 = DAT_00646ff0 * 0x70;
    __location = slang::diagnostics;
    do {
      std::ranges::__destroy_at_fn::operator()<slang::Diagnostic>
                ((__destroy_at_fn *)&std::ranges::destroy_at,__location);
      __location = __location + 1;
      lVar1 = lVar1 + -0x70;
    } while (lVar1 != 0);
  }
  DAT_00646ff0 = 0;
  this = getSourceManager();
  slang::SourceManager::assignText(&local_338,this,text,(SourceLocation)0x0,(SourceLibrary *)0x0);
  local_378.commentHandlers.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
  .arrays.groups_size_index = 0x3f;
  local_378.commentHandlers.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
  .arrays.groups_size_mask = 1;
  local_378.commentHandlers.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  local_378.commentHandlers.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
  .arrays.groups_ =
       (group_type_pointer)
       boost::unordered::detail::foa::
       dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
       ::storage;
  local_378.commentHandlers.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
  .size_ctrl.ml = 0;
  local_378.commentHandlers.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
  .size_ctrl.size = 0;
  local_378.maxErrors = 0x10;
  local_378.languageVersion = Default;
  local_378.enableLegacyProtect = false;
  buffer_00.data._M_str = local_338.data._M_str;
  buffer_00.data._M_len = local_338.data._M_len;
  buffer_00.library = local_338.library;
  buffer_00.id.id = local_338.id.id;
  buffer_00._28_4_ = local_338._28_4_;
  slang::parsing::Lexer::Lexer
            (&local_318,buffer_00,(BumpAllocator *)slang::alloc,(Diagnostics *)&slang::diagnostics,
             this,&local_378);
  boost::unordered::detail::foa::
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
  ::~table_core((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
                 *)&local_378);
  local_3e8 = slang::parsing::Lexer::lex(&local_318);
  local_390._vptr_ITransientExpression = (_func_int **)0x4b60b8;
  local_390.m_isBinaryExpression = true;
  local_390.m_result = false;
  local_390._10_6_ = 0;
  macroName.m_size = 7;
  macroName.m_start = "REQUIRE";
  capturedExpression.m_size = 5;
  capturedExpression.m_start = "token";
  Catch::AssertionHandler::AssertionHandler
            (&local_3d8,macroName,(SourceLineInfo *)&local_390,capturedExpression,Normal);
  local_380 = &local_3e8;
  local_390._8_8_ = (ulong)CONCAT61(local_390._10_6_,local_3e8.info != (Info *)0x0) << 8;
  local_390._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_006269c8;
  Catch::AssertionHandler::handleExpr(&local_3d8,&local_390);
  Catch::AssertionHandler::complete(&local_3d8);
  if (local_3d8.m_completed == false) {
    (*(local_3d8.m_resultCapture)->_vptr_IResultCapture[0x14])();
  }
  if (local_318.stringBuffer.super_SmallVectorBase<char>.data_ !=
      local_318.stringBuffer.super_SmallVectorBase<char>.firstElement) {
    operator_delete(local_318.stringBuffer.super_SmallVectorBase<char>.data_);
  }
  if (local_318.triviaBuffer.super_SmallVectorBase<slang::parsing::Trivia>.data_ !=
      (pointer)local_318.triviaBuffer.super_SmallVectorBase<slang::parsing::Trivia>.firstElement) {
    operator_delete(local_318.triviaBuffer.super_SmallVectorBase<slang::parsing::Trivia>.data_);
  }
  boost::unordered::detail::foa::
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
  ::~table_core((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
                 *)&local_318.options);
  return local_3e8;
}

Assistant:

Token lexRawToken(std::string_view text) {
    diagnostics.clear();
    auto& sm = getSourceManager();
    auto buffer = sm.assignText(text);
    Lexer lexer(buffer, alloc, diagnostics, sm);

    Token token = lexer.lex();
    REQUIRE(token);
    return token;
}